

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.cc
# Opt level: O2

t_pvalue __thiscall
xemmai::t_type_of<long>::f__subtract(t_type_of<long> *this,intptr_t a_self,t_pvalue *a_value)

{
  double dVar1;
  t_object *a_object;
  long lVar2;
  bool bVar3;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar4;
  wstring_view a_message;
  
  a_object = (a_value->super_t_pointer).v_p;
  if (a_object == (t_object *)0x4) {
    dVar1 = (a_value->field_0).v_float;
    (this->
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    ).super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
    v_this.v_p._M_b = (__base_type)0x4;
    (this->
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    ).super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
    v_depth = (size_t)((double)a_self - dVar1);
  }
  else {
    if (a_object == (t_object *)0x3) {
      lVar2 = (a_value->field_0).v_integer;
    }
    else {
      bVar3 = t_cast<long>::f_is(a_object);
      if (!bVar3) {
        a_message._M_str = L"not supported.";
        a_message._M_len = 0xe;
        f_throw(a_message);
      }
      lVar2 = *(long *)a_object->v_data;
      a_value = (t_pvalue *)extraout_RDX;
    }
    (this->
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    ).super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
    v_this.v_p._M_b = (__base_type)0x3;
    (this->
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    ).super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
    v_depth = a_self - lVar2;
  }
  tVar4.field_0 =
       (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)
       (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)a_value;
  tVar4.super_t_pointer.v_p = (t_object *)this;
  return tVar4;
}

Assistant:

t_pvalue t_type_of<intptr_t>::f__subtract(intptr_t a_self, const t_pvalue& a_value)
{
	switch (a_value.f_tag()) {
	case c_tag__INTEGER:
		return a_self - a_value.v_integer;
	case c_tag__FLOAT:
		return a_self - a_value.v_float;
	}
	t_object* p = a_value;
	if (f_is<intptr_t>(p)) return a_self - p->f_as<intptr_t>();
	f_throw(L"not supported."sv);
}